

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncode.c
# Opt level: O0

int testEncode(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  cmsysMD5 *md5_00;
  cmsysMD5 *md5;
  int result;
  char **argv_local;
  int argc_local;
  
  md5_00 = cmsysMD5_New();
  uVar1 = testMD5_1(md5_00);
  uVar2 = testMD5_2(md5_00);
  cmsysMD5_Delete(md5_00);
  return uVar2 | uVar1;
}

Assistant:

int testEncode(int argc, char* argv[])
{
  int result = 0;
  (void)argc;
  (void)argv;

  /* Test MD5 digest.  */
  {
    kwsysMD5* md5 = kwsysMD5_New();
    result |= testMD5_1(md5);
    result |= testMD5_2(md5);
    kwsysMD5_Delete(md5);
  }

  return result;
}